

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDASetJacFn(void *ida_mem,IDALsJacFn jac)

{
  int iVar1;
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IDAMem local_20;
  IDALsMem local_18;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetJacFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (jac == (IDALsJacFn)0x0) {
      local_18->jacDQ = 1;
      local_18->jac = idaLsDQJac;
    }
    else {
      if (local_18->J == (SUNMatrix)0x0) {
        IDAProcessError(local_20,-3,0x130,"IDASetJacFn",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                        ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      local_18->jacDQ = 0;
      local_18->jac = jac;
      local_20 = (IDAMem)local_20->ida_user_data;
    }
    local_18->J_data = local_20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDASetJacFn(void* ida_mem, IDALsJacFn jac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (idals_mem->J == NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (IDALS_ILL_INPUT);
  }

  /* set Jacobian routine pointer, and update relevant flags */
  if (jac != NULL)
  {
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = jac;
    idals_mem->J_data = IDA_mem->ida_user_data;
  }
  else
  {
    idals_mem->jacDQ  = SUNTRUE;
    idals_mem->jac    = idaLsDQJac;
    idals_mem->J_data = IDA_mem;
  }

  return (IDALS_SUCCESS);
}